

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtAig.c
# Opt level: O2

Aig_Man_t *
Cgt_ManDupPartition(Aig_Man_t *pFrame,int nVarsMin,int nFlopsMin,int iStart,Aig_Man_t *pCare,
                   Vec_Vec_t *vSuppsInv,int *pnOutputs)

{
  Vec_Ptr_t *p;
  Vec_Ptr_t *vLeaves;
  Vec_Ptr_t *p_00;
  Aig_Man_t *pNew;
  char *pcVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  void *pvVar4;
  int iVar5;
  int i;
  int iVar6;
  
  if (pFrame->nRegs != 0) {
    __assert_fail("Aig_ManRegNum(pFrame) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cgt/cgtAig.c"
                  ,0x1bf,
                  "Aig_Man_t *Cgt_ManDupPartition(Aig_Man_t *, int, int, int, Aig_Man_t *, Vec_Vec_t *, int *)"
                 );
  }
  p = Vec_PtrAlloc(100);
  vLeaves = Vec_PtrAlloc(100);
  p_00 = Vec_PtrAlloc(100);
  pNew = Aig_ManStart(nVarsMin);
  pcVar1 = Abc_UtilStrsav("partition");
  pNew->pName = pcVar1;
  Aig_ManIncrementTravId(pFrame);
  pFrame->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)pNew->pConst1;
  pFrame->pConst1->TravId = pFrame->nTravIds;
  iVar5 = nFlopsMin + iStart;
  for (; (iStart < iVar5 && (iStart < pFrame->nObjs[3])); iStart = iStart + 1) {
    pAVar2 = Aig_ManCo(pFrame,iStart);
    Cgt_ManDupPartition_rec
              (pNew,pFrame,(Aig_Obj_t *)((ulong)pAVar2->pFanin0 & 0xfffffffffffffffe),vLeaves);
    pAVar3 = Aig_ObjChild0Copy(pAVar2);
    Vec_PtrPush(p,pAVar3);
    Vec_PtrPush(p_00,pAVar2);
  }
  for (; (pNew->vObjs->nSize - pNew->nDeleted < nVarsMin && (iStart < pFrame->nObjs[3]));
      iStart = iStart + 1) {
    pAVar2 = Aig_ManCo(pFrame,iStart);
    Cgt_ManDupPartition_rec
              (pNew,pFrame,(Aig_Obj_t *)((ulong)pAVar2->pFanin0 & 0xfffffffffffffffe),vLeaves);
    pAVar3 = Aig_ObjChild0Copy(pAVar2);
    Vec_PtrPush(p,pAVar3);
    Vec_PtrPush(p_00,pAVar2);
  }
  if (pCare != (Aig_Man_t *)0x0) {
    Cgt_ManConstructCare(pNew,pCare,vSuppsInv,vLeaves);
  }
  iVar5 = p_00->nSize;
  iVar6 = 0;
  i = 0;
  if (0 < iVar5) {
    iVar6 = iVar5;
    i = 0;
  }
  for (; iVar6 != i; i = i + 1) {
    pvVar4 = Vec_PtrEntry(p_00,i);
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p,i);
    pAVar2 = Aig_ObjCreateCo(pNew,pAVar2);
    *(Aig_Obj_t **)((long)pvVar4 + 0x28) = pAVar2;
  }
  if (pnOutputs != (int *)0x0) {
    *pnOutputs = iVar5;
  }
  Vec_PtrFree(p);
  Vec_PtrFree(vLeaves);
  Vec_PtrFree(p_00);
  return pNew;
}

Assistant:

Aig_Man_t * Cgt_ManDupPartition( Aig_Man_t * pFrame, int nVarsMin, int nFlopsMin, int iStart, Aig_Man_t * pCare, Vec_Vec_t * vSuppsInv, int * pnOutputs )
{
    Vec_Ptr_t * vRoots, * vLeaves, * vPos;
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    assert( Aig_ManRegNum(pFrame) == 0 );
    vRoots = Vec_PtrAlloc( 100 );
    vLeaves = Vec_PtrAlloc( 100 ); 
    vPos = Vec_PtrAlloc( 100 );
    pNew = Aig_ManStart( nVarsMin );
    pNew->pName = Abc_UtilStrsav( "partition" );
    Aig_ManIncrementTravId( pFrame );
    Aig_ManConst1(pFrame)->pData = Aig_ManConst1(pNew);
    Aig_ObjSetTravIdCurrent( pFrame, Aig_ManConst1(pFrame) );
    for ( i = iStart; i < iStart + nFlopsMin && i < Aig_ManCoNum(pFrame); i++ )
    {
        pObj = Aig_ManCo( pFrame, i );
        Cgt_ManDupPartition_rec( pNew, pFrame, Aig_ObjFanin0(pObj), vLeaves );
        Vec_PtrPush( vRoots, Aig_ObjChild0Copy(pObj) );
        Vec_PtrPush( vPos, pObj );
    }
    for ( ; Aig_ManObjNum(pNew) < nVarsMin && i < Aig_ManCoNum(pFrame); i++ )
    {
        pObj = Aig_ManCo( pFrame, i );
        Cgt_ManDupPartition_rec( pNew, pFrame, Aig_ObjFanin0(pObj), vLeaves );
        Vec_PtrPush( vRoots, Aig_ObjChild0Copy(pObj) );
        Vec_PtrPush( vPos, pObj );
    }
    assert( nFlopsMin >= Vec_PtrSize(vRoots) || Vec_PtrSize(vRoots) >= nFlopsMin );
    // create constaints
    if ( pCare )
        Cgt_ManConstructCare( pNew, pCare, vSuppsInv, vLeaves );
    // create POs
    Vec_PtrForEachEntry( Aig_Obj_t *, vPos, pObj, i )
        pObj->pData = (Aig_Obj_t *)Aig_ObjCreateCo( pNew, (Aig_Obj_t *)Vec_PtrEntry(vRoots, i) );
    if ( pnOutputs != NULL )
        *pnOutputs = Vec_PtrSize( vPos );
    Vec_PtrFree( vRoots );
    Vec_PtrFree( vLeaves );
    Vec_PtrFree( vPos );
    return pNew;
}